

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O0

void __thiscall manager::Manager<ttt::Board>::RoundRobin(Manager<ttt::Board> *this)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false> *in_RDI;
  iterator it2;
  iterator it1;
  int in_stack_0000005c;
  longlong in_stack_00000060;
  longlong in_stack_00000068;
  Manager<ttt::Board> *in_stack_00000070;
  unordered_map<long_long,_manager::Bot<ttt::Board>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> local_20;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> local_18;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> local_10 [2];
  
  local_10[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<long_long,_manager::Bot<ttt::Board>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_18._M_cur =
         (__node_type *)
         std::
         unordered_map<long_long,_manager::Bot<ttt::Board>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::__detail::operator!=(local_10,&local_18);
    if (!bVar1) break;
    local_20._M_cur = local_10[0]._M_cur;
    std::__detail::
    _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>::operator++
              (in_RDI);
    while( true ) {
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_map<long_long,_manager::Bot<ttt::Board>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>_>
           ::end(in_stack_ffffffffffffffb8);
      bVar1 = std::__detail::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
                             *)0x2266c2);
      in_stack_ffffffffffffffb8 =
           (unordered_map<long_long,_manager::Bot<ttt::Board>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>_>
            *)ppVar2->second->id;
      std::__detail::
      _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
                  *)0x2266d7);
      Match(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c);
      std::__detail::
      _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>::
      operator++(in_RDI);
    }
    std::__detail::
    _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>::operator++
              (in_RDI);
  }
  return;
}

Assistant:

void
Manager<IGame>::RoundRobin()
{
    for (auto it1 = bots.begin(); it1 != bots.end(); ++it1)
    {
        auto it2 = it1;
        ++it2;
        for (; it2 != bots.end(); ++it2)
            Match(it1->second->id, it2->second->id, 2);
    }
}